

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ImGuiID IVar4;
  ImGuiItemStatusFlags IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  pIVar6 = GImGui;
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = frame_padding;
  frame_padding_local = (ImVec2)vmovlps_avx(auVar11._0_16_);
  auVar12._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
  auVar12._8_56_ = extraout_var;
  label_size = (ImVec2)vmovlps_avx(auVar12._0_16_);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar13 = (bb->Min).x;
  fVar16 = (bb->Max).x;
  if (1.0 < fVar16 - fVar13) {
    auVar15 = vinsertps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)(bb->Min).y),0x10);
    auVar14._0_4_ = auVar15._0_4_ + frame_padding_local.x;
    auVar14._4_4_ = auVar15._4_4_ + frame_padding_local.y;
    auVar14._8_4_ = auVar15._8_4_ + 0.0;
    auVar14._12_4_ = auVar15._12_4_ + 0.0;
    fVar16 = fVar16 - frame_padding_local.x;
    fVar13 = (bb->Max).y;
    if ((flags & 1U) != 0) {
      local_48 = auVar14;
      IVar9 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar16 = fVar16 - IVar9.x;
      auVar10._8_8_ = 0;
      auVar10._0_4_ = frame_padding_local.x;
      auVar10._4_4_ = frame_padding_local.y;
      auVar2 = vmovshdup_avx(auVar10);
      auVar15 = vcvtdq2ps_avx(ZEXT416((uint)(int)(pIVar6->FontSize * -0.25)));
      auVar14 = vminss_avx(ZEXT416((uint)(frame_padding_local.x + (bb->Min).x + label_size.x + 2.0))
                           ,ZEXT416((uint)fVar16));
      local_68.y = auVar2._0_4_ + (bb->Min).y + auVar15._0_4_;
      local_68.x = auVar14._0_4_;
      auVar15._8_8_ = 0;
      auVar15._0_4_ = (bb->Max).x;
      auVar15._4_4_ = (bb->Max).y;
      auVar15 = vsubps_avx(auVar15,auVar10);
      local_80 = (ImVec2)vmovlps_avx(auVar15);
      local_70.x = 0.0;
      local_70.y = 0.0;
      RenderTextClippedEx(draw_list,&local_68,&local_80,"*",(char *)0x0,(ImVec2 *)0x0,&local_70,
                          (ImRect *)0x0);
      auVar14 = local_48;
    }
    local_80 = (ImVec2)vmovlps_avx(auVar14);
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = fVar16 < auVar14._0_4_ + label_size.x;
    }
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         ((bb->Max).x - (bb->Min).x < (pIVar6->Style).TabMinWidthForCloseButton)))) ||
       ((pIVar6->HoveredId != close_button_id && pIVar6->HoveredId != tab_id &&
        (pIVar6->ActiveId != tab_id && pIVar6->ActiveId != close_button_id)))) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    local_78.x = fVar16;
    local_78.y = fVar13;
    if (bVar3) {
      pIVar1 = GImGui->CurrentWindow;
      local_68 = (pIVar1->DC).LastItemRect.Min;
      IStack_60 = (pIVar1->DC).LastItemRect.Max;
      local_58 = (pIVar1->DC).LastItemDisplayRect.Min;
      IStack_50 = (pIVar1->DC).LastItemDisplayRect.Max;
      fVar13 = pIVar6->FontSize;
      IVar4 = (pIVar1->DC).LastItemId;
      IVar5 = (pIVar1->DC).LastItemStatusFlags;
      PushStyleVar(10,&frame_padding_local);
      local_70.y = (bb->Min).y;
      local_70.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar13;
      bVar7 = CloseButton(close_button_id,&local_70);
      PopStyleVar(1);
      pIVar1 = GImGui->CurrentWindow;
      (pIVar1->DC).LastItemId = IVar4;
      (pIVar1->DC).LastItemStatusFlags = IVar5;
      (pIVar1->DC).LastItemRect.Min = local_68;
      (pIVar1->DC).LastItemRect.Max = IStack_60;
      (pIVar1->DC).LastItemDisplayRect.Min = local_58;
      (pIVar1->DC).LastItemDisplayRect.Max = IStack_50;
      if ((flags & 4U) == 0) {
        bVar8 = IsMouseClicked(2,false);
        if (bVar8) {
          bVar7 = true;
        }
      }
      fVar16 = fVar16 - fVar13;
    }
    else {
      bVar7 = false;
    }
    fVar13 = fVar16;
    if (!bVar3) {
      fVar13 = (bb->Max).x + -1.0;
    }
    RenderTextEllipsis(draw_list,&local_80,&local_78,fVar16,fVar13,label,(char *)0x0,&label_size);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar7;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiLastItemDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}